

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_selectable(nk_command_buffer *out,nk_flags state,nk_style_selectable *style,int active,
                       nk_rect *bounds,nk_rect *icon,nk_image *img,nk_symbol_type sym,char *string,
                       int len,nk_flags align,nk_user_font *font)

{
  undefined1 local_50 [8];
  nk_text text;
  nk_style_item *background;
  nk_rect *icon_local;
  nk_rect *bounds_local;
  int active_local;
  nk_style_selectable *style_local;
  nk_flags state_local;
  nk_command_buffer *out_local;
  
  local_50 = *(undefined1 (*) [8])&style->padding;
  if (active == 0) {
    if ((state & 0x20) == 0) {
      if ((state & 0x10) == 0) {
        text.padding.y = *(float *)&style->text_normal;
        text._8_8_ = style;
      }
      else {
        text._8_8_ = &style->hover;
        text.padding.y = *(float *)&style->text_hover;
      }
    }
    else {
      text._8_8_ = &style->pressed;
      text.padding.y = *(float *)&style->text_pressed;
    }
  }
  else if ((state & 0x20) == 0) {
    if ((state & 0x10) == 0) {
      text._8_8_ = &style->normal_active;
      text.padding.y = *(float *)&style->text_normal_active;
    }
    else {
      text._8_8_ = &style->hover_active;
      text.padding.y = *(float *)&style->text_hover_active;
    }
  }
  else {
    text._8_8_ = &style->pressed_active;
    text.padding.y = *(float *)&style->text_pressed_active;
  }
  if (*(int *)text._8_8_ == 1) {
    nk_draw_image(out,*bounds,(nk_image *)(text._8_8_ + 8),(nk_color)0xffffffff);
    text.padding.x = (float)nk_rgba(0,0,0,0);
  }
  else {
    nk_fill_rect(out,*bounds,style->rounding,*(nk_color *)(text._8_8_ + 8));
    text.padding.x = *(float *)(text._8_8_ + 8);
  }
  if (icon != (nk_rect *)0x0) {
    if (img == (nk_image *)0x0) {
      nk_draw_symbol(out,sym,*icon,(nk_color)text.padding.x,(nk_color)text.padding.y,1.0,font);
    }
    else {
      nk_draw_image(out,*icon,img,(nk_color)0xffffffff);
    }
  }
  nk_widget_text(out,*bounds,string,len,(nk_text *)local_50,align,font);
  return;
}

Assistant:

NK_LIB void
nk_draw_selectable(struct nk_command_buffer *out,
    nk_flags state, const struct nk_style_selectable *style, int active,
    const struct nk_rect *bounds,
    const struct nk_rect *icon, const struct nk_image *img, enum nk_symbol_type sym,
    const char *string, int len, nk_flags align, const struct nk_user_font *font)
{
    const struct nk_style_item *background;
    struct nk_text text;
    text.padding = style->padding;

    /* select correct colors/images */
    if (!active) {
        if (state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->pressed;
            text.text = style->text_pressed;
        } else if (state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text.text = style->text_hover;
        } else {
            background = &style->normal;
            text.text = style->text_normal;
        }
    } else {
        if (state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->pressed_active;
            text.text = style->text_pressed_active;
        } else if (state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover_active;
            text.text = style->text_hover_active;
        } else {
            background = &style->normal_active;
            text.text = style->text_normal_active;
        }
    }
    /* draw selectable background and text */
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
        text.background = nk_rgba(0,0,0,0);
    } else {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        text.background = background->data.color;
    }
    if (icon) {
        if (img) nk_draw_image(out, *icon, img, nk_white);
        else nk_draw_symbol(out, sym, *icon, text.background, text.text, 1, font);
    }
    nk_widget_text(out, *bounds, string, len, &text, align, font);
}